

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O1

ZSTD_CCtx * ZSTD_initStaticCCtx(void *workspace,size_t workspaceSize)

{
  ZSTD_cwksp *ws_00;
  ZSTD_compressedBlockState_t *pZVar1;
  U32 *pUVar2;
  uint *puVar3;
  long lVar4;
  uint uVar5;
  ZSTD_cwksp *pZVar6;
  ZSTD_cwksp *pZVar7;
  ZSTD_compressedBlockState_t *pZVar8;
  U32 *pUVar9;
  byte bVar10;
  ZSTD_cwksp ws;
  ZSTD_cwksp local_68;
  
  bVar10 = 0;
  if (((ulong)workspace & 7) == 0 && 0x1478 < workspaceSize) {
    local_68.workspaceEnd = (void *)((long)workspace + workspaceSize);
    local_68.allocStart = (void *)((ulong)local_68.workspaceEnd & 0xffffffffffffffc0);
    local_68.phase = ZSTD_cwksp_alloc_objects;
    local_68.isStatic = ZSTD_cwksp_static_alloc;
    local_68._56_8_ = local_68._56_8_ & 0xffffffffffffff00;
    local_68.workspace = workspace;
    local_68.objectEnd = workspace;
    local_68.tableEnd = workspace;
    local_68.tableValidEnd = workspace;
    local_68.initOnceStart = local_68.allocStart;
    ZSTD_cwksp_assert_internal_consistency(&local_68);
    local_68._56_8_ = local_68._56_8_ & 0xffffffff;
    ZSTD_cwksp_assert_internal_consistency(&local_68);
    ZSTD_cwksp_assert_internal_consistency(&local_68);
    if ((long)workspaceSize < 0x1478) {
      local_68.allocFailed = 1;
      workspace = (ZSTD_CCtx *)0x0;
    }
    else {
      local_68.objectEnd = (void *)((long)workspace + 0x1478);
      local_68.tableEnd = local_68.objectEnd;
      local_68.tableValidEnd = local_68.objectEnd;
    }
    if ((ZSTD_CCtx *)workspace != (ZSTD_CCtx *)0x0) {
      memset(workspace,0,0x1478);
      ws_00 = &((ZSTD_CCtx *)workspace)->workspace;
      pZVar6 = &local_68;
      pZVar7 = ws_00;
      for (lVar4 = 9; lVar4 != 0; lVar4 = lVar4 + -1) {
        pZVar7->workspace = pZVar6->workspace;
        pZVar6 = (ZSTD_cwksp *)((long)pZVar6 + ((ulong)bVar10 * -2 + 1) * 8);
        pZVar7 = (ZSTD_cwksp *)((long)pZVar7 + (ulong)bVar10 * -0x10 + 8);
      }
      local_68.initOnceStart = (void *)0x0;
      local_68.allocFailed = '\0';
      local_68._57_3_ = 0;
      local_68.workspaceOversizedDuration = 0;
      local_68.tableValidEnd = (void *)0x0;
      local_68.allocStart = (void *)0x0;
      local_68.objectEnd = (void *)0x0;
      local_68.tableEnd = (void *)0x0;
      local_68.workspace = (void *)0x0;
      local_68.workspaceEnd = (void *)0x0;
      local_68.phase = ZSTD_cwksp_alloc_objects;
      local_68.isStatic = ZSTD_cwksp_dynamic_alloc;
      ((ZSTD_CCtx *)workspace)->staticSize = workspaceSize;
      if (0x4ed7 < (ulong)((long)(((ZSTD_CCtx *)workspace)->workspace).allocStart -
                          (long)(((ZSTD_CCtx *)workspace)->workspace).tableEnd)) {
        pZVar8 = (ZSTD_compressedBlockState_t *)(((ZSTD_CCtx *)workspace)->workspace).objectEnd;
        if (((ulong)pZVar8 & 7) == 0) {
          ZSTD_cwksp_assert_internal_consistency(ws_00);
          if (((((ZSTD_CCtx *)workspace)->workspace).phase == ZSTD_cwksp_alloc_objects) &&
             (pZVar1 = pZVar8 + 1,
             pZVar1 <= (ZSTD_compressedBlockState_t *)
                       (((ZSTD_CCtx *)workspace)->workspace).workspaceEnd)) {
            (((ZSTD_CCtx *)workspace)->workspace).objectEnd = pZVar1;
            (((ZSTD_CCtx *)workspace)->workspace).tableEnd = pZVar1;
            (((ZSTD_CCtx *)workspace)->workspace).tableValidEnd = pZVar1;
          }
          else {
            (((ZSTD_CCtx *)workspace)->workspace).allocFailed = '\x01';
            pZVar8 = (ZSTD_compressedBlockState_t *)0x0;
          }
          (((ZSTD_CCtx *)workspace)->blockState).prevCBlock = pZVar8;
          pZVar8 = (ZSTD_compressedBlockState_t *)(((ZSTD_CCtx *)workspace)->workspace).objectEnd;
          if (((ulong)pZVar8 & 7) == 0) {
            ZSTD_cwksp_assert_internal_consistency(ws_00);
            if (((((ZSTD_CCtx *)workspace)->workspace).phase == ZSTD_cwksp_alloc_objects) &&
               (pZVar1 = pZVar8 + 1,
               pZVar1 <= (ZSTD_compressedBlockState_t *)
                         (((ZSTD_CCtx *)workspace)->workspace).workspaceEnd)) {
              (((ZSTD_CCtx *)workspace)->workspace).objectEnd = pZVar1;
              (((ZSTD_CCtx *)workspace)->workspace).tableEnd = pZVar1;
              (((ZSTD_CCtx *)workspace)->workspace).tableValidEnd = pZVar1;
            }
            else {
              (((ZSTD_CCtx *)workspace)->workspace).allocFailed = '\x01';
              pZVar8 = (ZSTD_compressedBlockState_t *)0x0;
            }
            (((ZSTD_CCtx *)workspace)->blockState).nextCBlock = pZVar8;
            pUVar9 = (U32 *)(((ZSTD_CCtx *)workspace)->workspace).objectEnd;
            if (((ulong)pUVar9 & 7) == 0) {
              ZSTD_cwksp_assert_internal_consistency(ws_00);
              if (((((ZSTD_CCtx *)workspace)->workspace).phase == ZSTD_cwksp_alloc_objects) &&
                 (pUVar2 = pUVar9 + 0x8b6,
                 pUVar2 <= (((ZSTD_CCtx *)workspace)->workspace).workspaceEnd)) {
                (((ZSTD_CCtx *)workspace)->workspace).objectEnd = pUVar2;
                (((ZSTD_CCtx *)workspace)->workspace).tableEnd = pUVar2;
                (((ZSTD_CCtx *)workspace)->workspace).tableValidEnd = pUVar2;
              }
              else {
                (((ZSTD_CCtx *)workspace)->workspace).allocFailed = '\x01';
                pUVar9 = (U32 *)0x0;
              }
              ((ZSTD_CCtx *)workspace)->entropyWorkspace = pUVar9;
              uVar5 = 0;
              puVar3 = (uint *)cpuid_basic_info(0);
              if (6 < *puVar3) {
                lVar4 = cpuid_Extended_Feature_Enumeration_info(7);
                uVar5 = *(uint *)(lVar4 + 4) >> 8 & 1;
              }
              ((ZSTD_CCtx *)workspace)->bmi2 = uVar5;
              return (ZSTD_CCtx *)workspace;
            }
          }
        }
        __assert_fail("(size_t)alloc % ZSTD_ALIGNOF(void*) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_cwksp.h"
                      ,0x1f2,"void *ZSTD_cwksp_reserve_object(ZSTD_cwksp *, size_t)");
      }
    }
  }
  return (ZSTD_CCtx *)0x0;
}

Assistant:

ZSTD_CCtx* ZSTD_initStaticCCtx(void* workspace, size_t workspaceSize)
{
    ZSTD_cwksp ws;
    ZSTD_CCtx* cctx;
    if (workspaceSize <= sizeof(ZSTD_CCtx)) return NULL;  /* minimum size */
    if ((size_t)workspace & 7) return NULL;  /* must be 8-aligned */
    ZSTD_cwksp_init(&ws, workspace, workspaceSize, ZSTD_cwksp_static_alloc);

    cctx = (ZSTD_CCtx*)ZSTD_cwksp_reserve_object(&ws, sizeof(ZSTD_CCtx));
    if (cctx == NULL) return NULL;

    ZSTD_memset(cctx, 0, sizeof(ZSTD_CCtx));
    ZSTD_cwksp_move(&cctx->workspace, &ws);
    cctx->staticSize = workspaceSize;

    /* statically sized space. entropyWorkspace never moves (but prev/next block swap places) */
    if (!ZSTD_cwksp_check_available(&cctx->workspace, ENTROPY_WORKSPACE_SIZE + 2 * sizeof(ZSTD_compressedBlockState_t))) return NULL;
    cctx->blockState.prevCBlock = (ZSTD_compressedBlockState_t*)ZSTD_cwksp_reserve_object(&cctx->workspace, sizeof(ZSTD_compressedBlockState_t));
    cctx->blockState.nextCBlock = (ZSTD_compressedBlockState_t*)ZSTD_cwksp_reserve_object(&cctx->workspace, sizeof(ZSTD_compressedBlockState_t));
    cctx->entropyWorkspace = (U32*)ZSTD_cwksp_reserve_object(&cctx->workspace, ENTROPY_WORKSPACE_SIZE);
    cctx->bmi2 = ZSTD_cpuid_bmi2(ZSTD_cpuid());
    return cctx;
}